

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

String * Rml::GetFontFaceDescription
                   (String *__return_storage_ptr__,String *font_family,FontStyle style,
                   FontWeight weight)

{
  undefined7 in_register_00000011;
  String font_attributes;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [20];
  uint local_9c;
  String local_98;
  String local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_c0 = local_b0;
  local_b8 = 0;
  local_b0[0] = 0;
  if ((int)CONCAT71(in_register_00000011,style) == 1) {
    ::std::__cxx11::string::append((char *)&local_c0);
  }
  if ((weight != Auto) && (weight != Normal)) {
    if (weight == Bold) {
      ::std::__cxx11::string::append((char *)&local_c0);
    }
    else {
      local_9c = (uint)weight;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      ToString<int>(&local_78,(int *)&local_9c,&local_98);
      ::std::operator+(&local_58,"weight=",&local_78);
      ::std::operator+(&local_38,&local_58,", ");
      ::std::__cxx11::string::append((string *)&local_c0);
      ::std::__cxx11::string::~string((string *)&local_38);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_98);
    }
  }
  if (local_b8 == 0) {
    ::std::__cxx11::string::assign((char *)&local_c0);
  }
  else {
    ::std::__cxx11::string::resize((ulong)&local_c0);
  }
  CreateString_abi_cxx11_
            (__return_storage_ptr__,"\'%s\' [%s]",(font_family->_M_dataplus)._M_p,local_c0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

String GetFontFaceDescription(const String& font_family, Style::FontStyle style, Style::FontWeight weight)
{
	String font_attributes;

	if (style == Style::FontStyle::Italic)
		font_attributes += "italic, ";
	if (weight == Style::FontWeight::Bold)
		font_attributes += "bold, ";
	else if (weight != Style::FontWeight::Auto && weight != Style::FontWeight::Normal)
		font_attributes += "weight=" + ToString((int)weight) + ", ";

	if (font_attributes.empty())
		font_attributes = "regular";
	else
		font_attributes.resize(font_attributes.size() - 2);

	return CreateString("'%s' [%s]", font_family.c_str(), font_attributes.c_str());
}